

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_archive.cpp
# Opt level: O1

bool WriteBase(ON_SubDComponentBase *base,ON_BinaryArchive *archive)

{
  ON__UINT32 i;
  ON__UINT32 i_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  byte bVar6;
  double P [3];
  double adStack_48 [4];
  
  i = base->m_id;
  i_00 = base->m_archive_id;
  uVar4 = ON_SubDComponentBase::SubdivisionLevel(base);
  bVar1 = ON_BinaryArchive::WriteInt(archive,i_00);
  bVar3 = true;
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(archive,i);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteShort(archive,(ON__UINT16)uVar4);
      if (bVar1) {
        iVar5 = ON_BinaryArchive::Archive3dmVersion(archive);
        if (iVar5 < 0x46) {
          bVar1 = ON_SubDComponentBase::GetSavedSubdivisionPoint(base,adStack_48);
          bVar2 = ON_BinaryArchive::WriteChar(archive,bVar1 << 2);
          base = (ON_SubDComponentBase *)0x1;
          bVar3 = true;
          if (bVar2) {
            if (bVar1) {
              bVar3 = ON_BinaryArchive::WriteDouble(archive,3,adStack_48);
              if (!bVar3) {
                ON_SubDIncrementErrorCount();
                bVar3 = true;
                goto LAB_00602283;
              }
            }
            bVar3 = ON_BinaryArchive::WriteChar(archive,'\0');
            bVar3 = !bVar3;
          }
        }
        else {
          bVar1 = Internal_WriteComponentAdditionSize(false,archive,'\x18');
          if (bVar1) {
            uVar4 = base->m_group_id;
            bVar1 = Internal_WriteComponentAdditionSize(uVar4 != 0,archive,'\x04');
            if (bVar1) {
              if (uVar4 != 0) {
                bVar1 = ON_BinaryArchive::WriteInt(archive,base->m_group_id);
                if (!bVar1) goto LAB_00602283;
              }
              bVar1 = ON_SubDComponentBase::InSymmetrySet(base);
              bVar2 = Internal_WriteComponentAdditionSize(bVar1,archive,'\x05');
              if (bVar2) {
                if (bVar1) {
                  bVar1 = Internal_WritesSymmetrySetNext(base,archive);
                  if (!bVar1) goto LAB_00602283;
                }
                bVar3 = Internal_FinishWritingComponentAdditions(archive);
                base = (ON_SubDComponentBase *)(ulong)bVar3;
                bVar3 = false;
              }
            }
          }
        }
      }
    }
  }
LAB_00602283:
  bVar6 = (byte)base;
  if (bVar3) {
    ON_SubDIncrementErrorCount();
    bVar6 = 0;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

static bool WriteBase(
  const ON_SubDComponentBase* base,
  ON_BinaryArchive& archive
  )
{
  for (;;)
  {
    unsigned int archive_id = base->ArchiveId();
    unsigned int id = base->m_id;
    unsigned short level = (unsigned short)base->SubdivisionLevel();
    if (!archive.WriteInt(archive_id))
      break;
    if (!archive.WriteInt(id))
      break;
    if (!archive.WriteShort(level))
      break;

    if (archive.Archive3dmVersion() < 70)
    {
      // version 6 3dm files
      double P[3];
      const bool bHaveP = base->GetSavedSubdivisionPoint(P);

      unsigned char cP = bHaveP ? 4U : 0U;
      if (!archive.WriteChar(cP))
        break;
      if (0 != cP)
      {
        if (!Internal_WriteDouble3(P, archive))
          break;
      }

      unsigned char deprecated_and_never_used_zero = 0U;
      if (!archive.WriteChar(deprecated_and_never_used_zero))
        break;
      return true;
    }
    
    // version 7 3dm files and later

    // never used displacement
    if ( false == Internal_WriteComponentAdditionSize(false,archive,24) )
      break;

    // 4 byte group id addition
    const bool bWriteGroupId = base->m_group_id > 0;
    if (false == Internal_WriteComponentAdditionSize(bWriteGroupId, archive, 4))
      break;
    if (bWriteGroupId)
    {
      if (!archive.WriteInt(base->m_group_id))
        break;
    }

    // 5 byte symmetry set next addition Dec 2020 Rhino 7.2 and later
    // 5 bytes = unsigned archive id + char flags
    const bool bWriteSymmetrySetNext = base->InSymmetrySet();
    if (false == Internal_WriteComponentAdditionSize(bWriteSymmetrySetNext, archive, 5))
      break;
    if (bWriteSymmetrySetNext)
    {
      if (!Internal_WritesSymmetrySetNext(*base,archive))
        break;
    }

    return Internal_FinishWritingComponentAdditions(archive);
  }
  return ON_SUBD_RETURN_ERROR(false);
}